

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t encoder_set_option(aom_codec_alg_priv_t_conflict *ctx,char *name,char *value)

{
  AV1_PRIMARY *pAVar1;
  bool bVar2;
  int iVar3;
  aom_codec_err_t aVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  char **ppcVar8;
  char *default_src;
  size_t size;
  char *err_msg;
  char *argv [2];
  arg arg;
  av1_extracfg extra_cfg;
  char *local_2c8;
  SEARCH_METHODS *pSStack_2c0;
  arg local_2b0;
  av1_extracfg local_288;
  
  if (value == (char *)0x0 || (name == (char *)0x0 || ctx == (aom_codec_alg_priv_t_conflict *)0x0))
  {
    return AOM_CODEC_INVALID_PARAM;
  }
  memcpy(&local_288,&ctx->extra_cfg,600);
  local_2c8 = (char *)0x0;
  pSStack_2c0 = "";
  sVar6 = strlen(name);
  sVar7 = strlen(value);
  size = sVar6 + sVar7 + 4;
  pAVar1 = ctx->ppi;
  err_msg = (pAVar1->error).detail;
  local_2c8 = (char *)aom_malloc(size);
  if (local_2c8 == (char *)0x0) {
    return AOM_CODEC_MEM_ERROR;
  }
  aVar4 = AOM_CODEC_OK;
  snprintf(local_2c8,size,"--%s=%s",name,value);
  iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.enable_keyframe_filtering,&local_2c8,
                           err_msg);
  if (iVar3 == 0) {
    iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.min_gf_interval,&local_2c8,err_msg);
    if (iVar3 == 0) {
      iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.max_gf_interval,&local_2c8,err_msg);
      if (iVar3 == 0) {
        iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.gf_min_pyr_height,&local_2c8,
                                 err_msg);
        if (iVar3 == 0) {
          iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.gf_max_pyr_height,&local_2c8,
                                   err_msg);
          if (iVar3 == 0) {
            iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.cpu_used_av1,&local_2c8,
                                     err_msg);
            if (iVar3 == 0) {
              iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.auto_altref,&local_2c8,
                                       err_msg);
              if (iVar3 == 0) {
                iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.noise_sens,&local_2c8,
                                         err_msg);
                if (iVar3 == 0) {
                  iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.sharpness,&local_2c8,
                                           err_msg);
                  if (iVar3 == 0) {
                    iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.static_thresh,
                                             &local_2c8,err_msg);
                    if (iVar3 == 0) {
                      iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.rowmtarg,&local_2c8,
                                               err_msg);
                      if (iVar3 == 0) {
                        iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.fpmtarg,&local_2c8
                                                 ,err_msg);
                        if (iVar3 == 0) {
                          iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.tile_cols,
                                                   &local_2c8,err_msg);
                          if (iVar3 == 0) {
                            iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.tile_rows,
                                                     &local_2c8,err_msg);
                            if (iVar3 == 0) {
                              iVar3 = arg_match_helper(&local_2b0,&g_av1_codec_arg_defs.auto_tiles,
                                                       &local_2c8,err_msg);
                              if (iVar3 == 0) {
                                iVar3 = arg_match_helper(&local_2b0,
                                                         &g_av1_codec_arg_defs.enable_tpl_model,
                                                         &local_2c8,err_msg);
                                if (iVar3 == 0) {
                                  iVar3 = arg_match_helper(&local_2b0,
                                                           &g_av1_codec_arg_defs.arnr_maxframes,
                                                           &local_2c8,err_msg);
                                  if (iVar3 == 0) {
                                    iVar3 = arg_match_helper(&local_2b0,
                                                             &g_av1_codec_arg_defs.arnr_strength,
                                                             &local_2c8,err_msg);
                                    if (iVar3 == 0) {
                                      iVar3 = arg_match_helper(&local_2b0,
                                                               &g_av1_codec_arg_defs.tune_metric,
                                                               &local_2c8,err_msg);
                                      if (iVar3 != 0) {
                                        local_288.tuning = arg_parse_enum_helper(&local_2b0,err_msg)
                                        ;
                                        bVar2 = false;
                                        aVar4 = AOM_CODEC_OK;
                                        if ((local_288.tuning & ~AOM_TUNE_SSIM) != AOM_TUNE_IQ)
                                        goto LAB_00188672;
                                        if ((ctx->cfg).g_usage == 2) {
                                          local_288.enable_qm = 1;
                                          local_288.qm_min = 2;
                                          local_288.qm_max = 10;
                                          local_288.sharpness = 7;
                                          local_288.dist_metric = AOM_DIST_METRIC_QM_PSNR;
                                          local_288.enable_cdef = 3;
                                          local_288.enable_chroma_deltaq = 1;
                                          local_288.deltaq_mode = '\x06';
                                        }
                                        else {
                                          aVar4 = AOM_CODEC_INCAPABLE;
                                        }
                                        goto LAB_0018840b;
                                      }
                                      iVar3 = arg_match_helper(&local_2b0,
                                                               &g_av1_codec_arg_defs.
                                                                partition_info_path,&local_2c8,
                                                               err_msg);
                                      if (iVar3 != 0) {
                                        ppcVar8 = &local_288.partition_info_path;
                                        default_src = ".";
LAB_0018894a:
                                        aVar4 = allocate_and_set_string
                                                          (value,default_src,ppcVar8,err_msg);
                                        goto LAB_0018840b;
                                      }
                                      iVar3 = arg_match_helper(&local_2b0,
                                                               &g_av1_codec_arg_defs.
                                                                enable_rate_guide_deltaq,&local_2c8,
                                                               err_msg);
                                      if (iVar3 == 0) {
                                        iVar3 = arg_match_helper(&local_2b0,
                                                                 &g_av1_codec_arg_defs.
                                                                  rate_distribution_info,&local_2c8,
                                                                 err_msg);
                                        if (iVar3 != 0) {
                                          ppcVar8 = &local_288.rate_distribution_info;
                                          default_src = "./rate_map.txt";
                                          goto LAB_0018894a;
                                        }
                                        iVar3 = arg_match_helper(&local_2b0,
                                                                 &g_av1_codec_arg_defs.dist_metric,
                                                                 &local_2c8,err_msg);
                                        if (iVar3 == 0) {
                                          iVar3 = arg_match_helper(&local_2b0,
                                                                   &g_av1_codec_arg_defs.cq_level,
                                                                   &local_2c8,err_msg);
                                          if (iVar3 == 0) {
                                            iVar3 = arg_match_helper(&local_2b0,
                                                                     &g_av1_codec_arg_defs.
                                                                      max_intra_rate_pct,&local_2c8,
                                                                     err_msg);
                                            if (iVar3 == 0) {
                                              iVar3 = arg_match_helper(&local_2b0,
                                                                       &g_av1_codec_arg_defs.
                                                                        max_inter_rate_pct,
                                                                       &local_2c8,err_msg);
                                              if (iVar3 == 0) {
                                                iVar3 = arg_match_helper(&local_2b0,
                                                                         &g_av1_codec_arg_defs.
                                                                          gf_cbr_boost_pct,
                                                                         &local_2c8,err_msg);
                                                if (iVar3 == 0) {
                                                  iVar3 = arg_match_helper(&local_2b0,
                                                                           &g_av1_codec_arg_defs.
                                                                            lossless,&local_2c8,
                                                                           err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_cdef,&local_2c8
                                                                             ,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .enable_restoration,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.force_video_mode,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_obmc,&local_2c8
                                                                             ,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  disable_trellis_quant,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_qm,&local_2c8,
                                                                             err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .qm_max,&local_2c8,
                                                                               err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.qm_min,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              num_tg,&local_2c8,
                                                                             err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .mtu_size,&local_2c8
                                                                               ,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.timing_info,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  frame_parallel_decoding,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_dual_filter,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_chroma_deltaq,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              aq_mode,&local_2c8,
                                                                             err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .deltaq_mode,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.deltaq_strength,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              deltalf_mode,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  frame_periodic_boost,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              tune_content,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  input_color_primaries,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  input_transfer_characteristics,&local_2c8,err_msg)
                                                  ;
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  input_matrix_coefficients,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  input_chroma_sample_position,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              superblock_size,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  error_resilient_mode,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              sframe_mode,&local_2c8
                                                                             ,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .film_grain_test,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.film_grain_table,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 != 0) {
                                                    ppcVar8 = &local_288.film_grain_table_filename;
                                                    goto LAB_00189e80;
                                                  }
                                                  iVar3 = arg_match_helper(&local_2b0,
                                                                           &g_av1_codec_arg_defs.
                                                                            cdf_update_mode,
                                                                           &local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_rect_partitions
                                                                             ,&local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_ab_partitions,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_1to4_partitions
                                                                             ,&local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .min_partition_size,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.max_partition_size,&local_2c8
                                                  ,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  enable_intra_edge_filter,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_order_hint,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .enable_tx64,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.enable_flip_idtx,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_rect_tx,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_dist_wtd_comp,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              max_reference_frames,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  reduced_reference_set,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_ref_frame_mvs,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .enable_masked_comp,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.enable_onesided_comp,
                                                  &local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_interintra_comp
                                                                             ,&local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_smooth_interintra,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_diff_wtd_comp,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_interinter_wedge,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  enable_interintra_wedge,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_global_motion,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_warped_motion,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_filter_intra,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .enable_smooth_intra
                                                                               ,&local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.enable_paeth_intra,&local_2c8
                                                  ,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_cfl_intra,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  enable_directional_intra,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_diagonal_intra,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .enable_overlay,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.enable_palette,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              enable_intrabc,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .enable_angle_delta,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.enable_low_complexity_decode,
                                                  &local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              reduced_tx_type_set,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .use_intra_dct_only,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.use_inter_dct_only,&local_2c8
                                                  ,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  use_intra_default_tx_only,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              quant_b_adapt,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  vbr_corpus_complexity_lap,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              set_tier_mask,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .set_min_cr,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.coeff_cost_upd_freq,
                                                  &local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              mode_cost_upd_freq,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .mv_cost_upd_freq,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.dv_cost_upd_freq,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              denoise_noise_level,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .denoise_block_size,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.enable_dnl_denoising,
                                                  &local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              target_seq_level_idx,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .
                                                  input_chroma_subsampling_x,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  input_chroma_subsampling_y,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              passes,&local_2c8,
                                                                             err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .fwd_kf_dist,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.two_pass_output,&local_2c8,
                                                  err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              second_pass_log,
                                                                             &local_2c8,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .loopfilter_control,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.auto_intra_tools_off,
                                                  &local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                                                                                                            
                                                  strict_level_conformance,&local_2c8,err_msg);
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              sb_qp_sweep,&local_2c8
                                                                             ,err_msg);
                                                    if (iVar3 == 0) {
                                                      iVar3 = arg_match_helper(&local_2b0,
                                                                               &g_av1_codec_arg_defs
                                                                                .kf_max_pyr_height,
                                                                               &local_2c8,err_msg);
                                                      if (iVar3 == 0) {
                                                        iVar3 = arg_match_helper(&local_2b0,
                                                                                 &
                                                  g_av1_codec_arg_defs.tile_width,&local_2c8,err_msg
                                                  );
                                                  if (iVar3 == 0) {
                                                    iVar3 = arg_match_helper(&local_2b0,
                                                                             &g_av1_codec_arg_defs.
                                                                              tile_height,&local_2c8
                                                                             ,err_msg);
                                                    if (iVar3 == 0) {
                                                      aVar4 = AOM_CODEC_OK;
                                                      snprintf(err_msg,200,
                                                               "Cannot find aom option %s",name);
                                                      bVar2 = true;
                                                      goto LAB_00188672;
                                                    }
                                                    iVar3 = arg_parse_list_helper
                                                                      (&local_2b0,
                                                                       (ctx->cfg).tile_heights,0x40,
                                                                       err_msg);
                                                    (ctx->cfg).tile_height_count = iVar3;
                                                  }
                                                  else {
                                                    iVar3 = arg_parse_list_helper
                                                                      (&local_2b0,
                                                                       (ctx->cfg).tile_widths,0x40,
                                                                       err_msg);
                                                    (ctx->cfg).tile_width_count = iVar3;
                                                  }
                                                  }
                                                  else {
                                                    local_288.kf_max_pyr_height =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.sb_qp_sweep =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.strict_level_conformance =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.auto_intra_tools_off =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.loopfilter_control =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  goto LAB_0018866d;
                                                  }
                                                  ppcVar8 = &local_288.second_pass_log;
                                                  }
                                                  else {
                                                    ppcVar8 = &local_288.two_pass_output;
                                                  }
LAB_00189e80:
                                                  bVar2 = false;
                                                  aVar4 = allocate_and_set_string
                                                                    (value,(char *)0x0,ppcVar8,
                                                                     err_msg);
                                                  goto LAB_00188672;
                                                  }
                                                  local_288.fwd_kf_dist =
                                                       arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  else {
                                                    local_288.passes =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.chroma_subsampling_y =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.chroma_subsampling_x =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = arg_parse_int_helper(&local_2b0,err_msg)
                                                    ;
                                                    if (iVar3 - 0xc80U < 0xfffff31d) {
                                                      bVar2 = false;
                                                      snprintf(err_msg,200,
                                                               "Invalid operating point index: %d");
                                                      aVar4 = AOM_CODEC_INVALID_PARAM;
                                                      goto LAB_00188672;
                                                    }
                                                    local_288.target_seq_level_idx
                                                    [(uint)(iVar3 / 100)] =
                                                         (char)iVar3 + (char)(iVar3 / 100) * -100;
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_dnl_denoising =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.noise_block_size =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = arg_parse_int_helper(&local_2b0,err_msg)
                                                    ;
                                                    local_288.noise_level = (float)iVar3 / 10.0;
                                                  }
                                                  }
                                                  else {
                                                    local_288.dv_cost_upd_freq =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.mv_cost_upd_freq =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.mode_cost_upd_freq =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.coeff_cost_upd_freq =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.min_cr =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.tier_mask =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.vbr_corpus_complexity_lap =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.quant_b_adapt =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.use_intra_default_tx_only =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.use_inter_dct_only =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.use_intra_dct_only =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.reduced_tx_type_set =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_low_complexity_decode =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_angle_delta =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_intrabc =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_palette =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_overlay =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_diagonal_intra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_directional_intra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_cfl_intra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_paeth_intra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_smooth_intra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_filter_intra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_warped_motion =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_global_motion =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_interintra_wedge =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_interinter_wedge =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_diff_wtd_comp =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_smooth_interintra =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_interintra_comp =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_onesided_comp =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_masked_comp =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_ref_frame_mvs =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_reduced_reference_set =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.max_reference_frames =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_dist_wtd_comp =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_rect_tx =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_flip_idtx =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_tx64 =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_order_hint =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_intra_edge_filter =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.max_partition_size =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.min_partition_size =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_1to4_partitions =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_ab_partitions =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_rect_partitions =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.cdf_update_mode =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.film_grain_test_vector =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.s_frame_mode =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.error_resilient_mode =
                                                         arg_parse_int_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.superblock_size =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.chroma_sample_position =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.matrix_coefficients =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.transfer_characteristics =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.color_primaries =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.content =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.frame_periodic_boost =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.deltalf_mode =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.deltaq_strength =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = arg_parse_uint_helper
                                                                      (&local_2b0,err_msg);
                                                    local_288.deltaq_mode = (DELTAQ_MODE)uVar5;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = arg_parse_uint_helper
                                                                      (&local_2b0,err_msg);
                                                    local_288.aq_mode = (AQ_MODE)uVar5;
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_chroma_deltaq =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_dual_filter =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.frame_parallel_decoding_mode =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.timing_info_type =
                                                         arg_parse_enum_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.mtu_size =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.num_tg =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = arg_parse_uint_helper
                                                                      (&local_2b0,err_msg);
                                                    local_288.qm_min = uVar5;
                                                  }
                                                  }
                                                  else {
                                                    uVar5 = arg_parse_uint_helper
                                                                      (&local_2b0,err_msg);
                                                    local_288.qm_max = uVar5;
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_qm =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.disable_trellis_quant =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_obmc =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.force_video_mode =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_restoration =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.enable_cdef =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                  }
                                                  else {
                                                    local_288.lossless =
                                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                                  }
                                                }
                                                else {
                                                  local_288.gf_cbr_boost_pct =
                                                       arg_parse_uint_helper(&local_2b0,err_msg);
                                                }
                                              }
                                              else {
                                                local_288.rc_max_inter_bitrate_pct =
                                                     arg_parse_uint_helper(&local_2b0,err_msg);
                                              }
                                            }
                                            else {
                                              local_288.rc_max_intra_bitrate_pct =
                                                   arg_parse_uint_helper(&local_2b0,err_msg);
                                            }
                                          }
                                          else {
                                            local_288.cq_level =
                                                 arg_parse_uint_helper(&local_2b0,err_msg);
                                          }
                                        }
                                        else {
                                          local_288.dist_metric =
                                               arg_parse_enum_helper(&local_2b0,err_msg);
                                        }
                                      }
                                      else {
                                        local_288.enable_rate_guide_deltaq =
                                             arg_parse_uint_helper(&local_2b0,err_msg);
                                      }
                                    }
                                    else {
                                      local_288.arnr_strength =
                                           arg_parse_uint_helper(&local_2b0,err_msg);
                                    }
                                  }
                                  else {
                                    local_288.arnr_max_frames =
                                         arg_parse_uint_helper(&local_2b0,err_msg);
                                  }
                                }
                                else {
                                  local_288.enable_tpl_model =
                                       arg_parse_uint_helper(&local_2b0,err_msg);
                                }
                              }
                              else {
                                local_288.auto_tiles = arg_parse_uint_helper(&local_2b0,err_msg);
                              }
                            }
                            else {
                              local_288.tile_rows = arg_parse_uint_helper(&local_2b0,err_msg);
                              if (local_288.auto_tiles != 0) {
                                builtin_strncpy((pAVar1->error).detail + 0x10,
                                                "rows because auto-tiles is alrea",0x20);
                                goto LAB_00188780;
                              }
                            }
                          }
                          else {
                            local_288.tile_columns = arg_parse_uint_helper(&local_2b0,err_msg);
                            if (local_288.auto_tiles != 0) {
                              builtin_strncpy((pAVar1->error).detail + 0x10,
                                              "cols because auto-tiles is alrea",0x20);
LAB_00188780:
                              builtin_strncpy(err_msg,"Cannot set tile-",0x10);
                              builtin_strncpy((pAVar1->error).detail + 0x30,"dy set.",8);
                              aVar4 = AOM_CODEC_INVALID_PARAM;
                              goto LAB_0018840b;
                            }
                          }
                        }
                        else {
                          local_288.fp_mt = arg_parse_uint_helper(&local_2b0,err_msg);
                        }
                      }
                      else {
                        local_288.row_mt = arg_parse_uint_helper(&local_2b0,err_msg);
                      }
                    }
                    else {
                      local_288.static_thresh = arg_parse_uint_helper(&local_2b0,err_msg);
                    }
                  }
                  else {
                    local_288.sharpness = arg_parse_uint_helper(&local_2b0,err_msg);
                  }
                }
                else {
                  local_288.noise_sensitivity = arg_parse_uint_helper(&local_2b0,err_msg);
                }
              }
              else {
                local_288.enable_auto_alt_ref = arg_parse_uint_helper(&local_2b0,err_msg);
              }
            }
            else {
              local_288.cpu_used = arg_parse_uint_helper(&local_2b0,err_msg);
            }
          }
          else {
            local_288.gf_max_pyr_height = arg_parse_uint_helper(&local_2b0,err_msg);
          }
        }
        else {
          local_288.gf_min_pyr_height = arg_parse_uint_helper(&local_2b0,err_msg);
        }
      }
      else {
        local_288.max_gf_interval = arg_parse_uint_helper(&local_2b0,err_msg);
      }
    }
    else {
      local_288.min_gf_interval = arg_parse_uint_helper(&local_2b0,err_msg);
    }
LAB_0018866d:
    bVar2 = false;
    aVar4 = AOM_CODEC_OK;
  }
  else {
    local_288.enable_keyframe_filtering = arg_parse_uint_helper(&local_2b0,err_msg);
LAB_0018840b:
    bVar2 = false;
  }
LAB_00188672:
  aom_free(local_2c8);
  if (aVar4 == AOM_CODEC_OK) {
    if (*err_msg == '\0') {
      (ctx->base).err_detail = (char *)0x0;
      aVar4 = AOM_CODEC_INVALID_PARAM;
      if (!bVar2) {
        aVar4 = update_extra_cfg(ctx,&local_288);
      }
    }
    else {
      (ctx->base).err_detail = err_msg;
      aVar4 = AOM_CODEC_INVALID_PARAM;
    }
  }
  else {
    (ctx->base).err_detail = err_msg;
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t encoder_set_option(aom_codec_alg_priv_t *ctx,
                                          const char *name, const char *value) {
  if (ctx == NULL || name == NULL || value == NULL)
    return AOM_CODEC_INVALID_PARAM;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  // Used to mock the argv with just one string "--{name}={value}"
  char *argv[2] = { NULL, "" };
  size_t len = strlen(name) + strlen(value) + 4;
  char *const err_string = ctx->ppi->error.detail;

#if __STDC_VERSION__ >= 201112L
  // We use the keyword _Static_assert because clang-cl does not allow the
  // convenience macro static_assert to be used in function scope. See
  // https://bugs.llvm.org/show_bug.cgi?id=48904.
  _Static_assert(sizeof(ctx->ppi->error.detail) >= ARG_ERR_MSG_MAX_LEN,
                 "The size of the err_msg buffer for arg_match_helper must be "
                 "at least ARG_ERR_MSG_MAX_LEN");
#else
  assert(sizeof(ctx->ppi->error.detail) >= ARG_ERR_MSG_MAX_LEN);
#endif

  argv[0] = aom_malloc(len * sizeof(argv[1][0]));
  if (!argv[0]) return AOM_CODEC_MEM_ERROR;
  snprintf(argv[0], len, "--%s=%s", name, value);
  struct arg arg;
  aom_codec_err_t err = AOM_CODEC_OK;

  int match = 1;
  if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_keyframe_filtering,
                       argv, err_string)) {
    extra_cfg.enable_keyframe_filtering =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.min_gf_interval, argv,
                              err_string)) {
    extra_cfg.min_gf_interval = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_gf_interval, argv,
                              err_string)) {
    extra_cfg.max_gf_interval = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.gf_min_pyr_height,
                              argv, err_string)) {
    extra_cfg.gf_min_pyr_height = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.gf_max_pyr_height,
                              argv, err_string)) {
    extra_cfg.gf_max_pyr_height = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.cpu_used_av1, argv,
                              err_string)) {
    extra_cfg.cpu_used = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.auto_altref, argv,
                              err_string)) {
    extra_cfg.enable_auto_alt_ref = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.noise_sens, argv,
                              err_string)) {
    extra_cfg.noise_sensitivity = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.sharpness, argv,
                              err_string)) {
    extra_cfg.sharpness = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.static_thresh, argv,
                              err_string)) {
    extra_cfg.static_thresh = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.rowmtarg, argv,
                              err_string)) {
    extra_cfg.row_mt = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.fpmtarg, argv,
                              err_string)) {
    extra_cfg.fp_mt = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_cols, argv,
                              err_string)) {
    extra_cfg.tile_columns = arg_parse_uint_helper(&arg, err_string);
    if (extra_cfg.auto_tiles) {
      snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
               "Cannot set tile-cols because auto-tiles is already set.");
      err = AOM_CODEC_INVALID_PARAM;
    }
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_rows, argv,
                              err_string)) {
    extra_cfg.tile_rows = arg_parse_uint_helper(&arg, err_string);
    if (extra_cfg.auto_tiles) {
      snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
               "Cannot set tile-rows because auto-tiles is already set.");
      err = AOM_CODEC_INVALID_PARAM;
    }
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.auto_tiles, argv,
                              err_string)) {
    extra_cfg.auto_tiles = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_tpl_model,
                              argv, err_string)) {
    extra_cfg.enable_tpl_model = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.arnr_maxframes, argv,
                              err_string)) {
    extra_cfg.arnr_max_frames = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.arnr_strength, argv,
                              err_string)) {
    extra_cfg.arnr_strength = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tune_metric, argv,
                              err_string)) {
    extra_cfg.tuning = arg_parse_enum_helper(&arg, err_string);
    err = handle_tuning(ctx, &extra_cfg);
  }
#if CONFIG_TUNE_VMAF
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.vmaf_model_path, argv,
                            err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.vmaf_model_path,
                                  &extra_cfg.vmaf_model_path, err_string);
  }
#endif
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.partition_info_path,
                            argv, err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.partition_info_path,
                                  &extra_cfg.partition_info_path, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_rate_guide_deltaq,
                              argv, err_string)) {
    extra_cfg.enable_rate_guide_deltaq =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.rate_distribution_info,
                              argv, err_string)) {
    err =
        allocate_and_set_string(value, default_extra_cfg.rate_distribution_info,
                                &extra_cfg.rate_distribution_info, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.dist_metric, argv,
                              err_string)) {
    extra_cfg.dist_metric = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.cq_level, argv,
                              err_string)) {
    extra_cfg.cq_level = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_intra_rate_pct,
                              argv, err_string)) {
    extra_cfg.rc_max_intra_bitrate_pct =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_inter_rate_pct,
                              argv, err_string)) {
    extra_cfg.rc_max_inter_bitrate_pct =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.gf_cbr_boost_pct,
                              argv, err_string)) {
    extra_cfg.gf_cbr_boost_pct = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.lossless, argv,
                              err_string)) {
    extra_cfg.lossless = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_cdef, argv,
                              err_string)) {
    extra_cfg.enable_cdef = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_restoration,
                              argv, err_string)) {
    extra_cfg.enable_restoration = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.force_video_mode,
                              argv, err_string)) {
    extra_cfg.force_video_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_obmc, argv,
                              err_string)) {
    extra_cfg.enable_obmc = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.disable_trellis_quant,
                              argv, err_string)) {
    extra_cfg.disable_trellis_quant = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_qm, argv,
                              err_string)) {
    extra_cfg.enable_qm = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.qm_max, argv,
                              err_string)) {
    extra_cfg.qm_max = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.qm_min, argv,
                              err_string)) {
    extra_cfg.qm_min = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.num_tg, argv,
                              err_string)) {
    extra_cfg.num_tg = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.mtu_size, argv,
                              err_string)) {
    extra_cfg.mtu_size = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.timing_info, argv,
                              err_string)) {
    extra_cfg.timing_info_type = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.frame_parallel_decoding,
                              argv, err_string)) {
    extra_cfg.frame_parallel_decoding_mode =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_dual_filter,
                              argv, err_string)) {
    extra_cfg.enable_dual_filter = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_chroma_deltaq,
                              argv, err_string)) {
    extra_cfg.enable_chroma_deltaq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.aq_mode, argv,
                              err_string)) {
    extra_cfg.aq_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.deltaq_mode, argv,
                              err_string)) {
    extra_cfg.deltaq_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.deltaq_strength, argv,
                              err_string)) {
    extra_cfg.deltaq_strength = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.deltalf_mode, argv,
                              err_string)) {
    extra_cfg.deltalf_mode = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.frame_periodic_boost,
                              argv, err_string)) {
    extra_cfg.frame_periodic_boost = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tune_content, argv,
                              err_string)) {
    extra_cfg.content = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.input_color_primaries,
                              argv, err_string)) {
    extra_cfg.color_primaries = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(
                 &arg, &g_av1_codec_arg_defs.input_transfer_characteristics,
                 argv, err_string)) {
    extra_cfg.transfer_characteristics =
        arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.input_matrix_coefficients,
                              argv, err_string)) {
    extra_cfg.matrix_coefficients = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(
                 &arg, &g_av1_codec_arg_defs.input_chroma_sample_position, argv,
                 err_string)) {
    extra_cfg.chroma_sample_position = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.superblock_size, argv,
                              err_string)) {
    extra_cfg.superblock_size = arg_parse_enum_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.error_resilient_mode,
                              argv, err_string)) {
    extra_cfg.error_resilient_mode = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.sframe_mode, argv,
                              err_string)) {
    extra_cfg.s_frame_mode = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.film_grain_test, argv,
                              err_string)) {
    extra_cfg.film_grain_test_vector = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.film_grain_table,
                              argv, err_string)) {
    if (value == NULL) {
      // this parameter allows NULL as its value
      extra_cfg.film_grain_table_filename = value;
    } else {
      err = allocate_and_set_string(
          value, default_extra_cfg.film_grain_table_filename,
          &extra_cfg.film_grain_table_filename, err_string);
    }
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.cdf_update_mode, argv,
                              err_string)) {
    extra_cfg.cdf_update_mode = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_rect_partitions,
                              argv, err_string)) {
    extra_cfg.enable_rect_partitions = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_ab_partitions,
                              argv, err_string)) {
    extra_cfg.enable_ab_partitions = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_1to4_partitions,
                              argv, err_string)) {
    extra_cfg.enable_1to4_partitions = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.min_partition_size,
                              argv, err_string)) {
    extra_cfg.min_partition_size = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_partition_size,
                              argv, err_string)) {
    extra_cfg.max_partition_size = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_intra_edge_filter,
                              argv, err_string)) {
    extra_cfg.enable_intra_edge_filter =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_order_hint,
                              argv, err_string)) {
    extra_cfg.enable_order_hint = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_tx64, argv,
                              err_string)) {
    extra_cfg.enable_tx64 = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_flip_idtx,
                              argv, err_string)) {
    extra_cfg.enable_flip_idtx = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_rect_tx, argv,
                              err_string)) {
    extra_cfg.enable_rect_tx = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_dist_wtd_comp,
                              argv, err_string)) {
    extra_cfg.enable_dist_wtd_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.max_reference_frames,
                              argv, err_string)) {
    extra_cfg.max_reference_frames = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.reduced_reference_set,
                              argv, err_string)) {
    extra_cfg.enable_reduced_reference_set =
        arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_ref_frame_mvs,
                              argv, err_string)) {
    extra_cfg.enable_ref_frame_mvs = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_masked_comp,
                              argv, err_string)) {
    extra_cfg.enable_masked_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_onesided_comp,
                              argv, err_string)) {
    extra_cfg.enable_onesided_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_interintra_comp,
                              argv, err_string)) {
    extra_cfg.enable_interintra_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_smooth_interintra,
                              argv, err_string)) {
    extra_cfg.enable_smooth_interintra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_diff_wtd_comp,
                              argv, err_string)) {
    extra_cfg.enable_diff_wtd_comp = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_interinter_wedge,
                              argv, err_string)) {
    extra_cfg.enable_interinter_wedge = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_interintra_wedge,
                              argv, err_string)) {
    extra_cfg.enable_interintra_wedge = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_global_motion,
                              argv, err_string)) {
    extra_cfg.enable_global_motion = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_warped_motion,
                              argv, err_string)) {
    extra_cfg.enable_warped_motion = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_filter_intra,
                              argv, err_string)) {
    extra_cfg.enable_filter_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_smooth_intra,
                              argv, err_string)) {
    extra_cfg.enable_smooth_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_paeth_intra,
                              argv, err_string)) {
    extra_cfg.enable_paeth_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_cfl_intra,
                              argv, err_string)) {
    extra_cfg.enable_cfl_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.enable_directional_intra,
                              argv, err_string)) {
    extra_cfg.enable_directional_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_diagonal_intra,
                              argv, err_string)) {
    extra_cfg.enable_diagonal_intra = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_overlay, argv,
                              err_string)) {
    extra_cfg.enable_overlay = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_palette, argv,
                              err_string)) {
    extra_cfg.enable_palette = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_intrabc, argv,
                              err_string)) {
    extra_cfg.enable_intrabc = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_angle_delta,
                              argv, err_string)) {
    extra_cfg.enable_angle_delta = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(
                 &arg, &g_av1_codec_arg_defs.enable_low_complexity_decode, argv,
                 err_string)) {
    extra_cfg.enable_low_complexity_decode =
        arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.reduced_tx_type_set,
                              argv, err_string)) {
    extra_cfg.reduced_tx_type_set = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.use_intra_dct_only,
                              argv, err_string)) {
    extra_cfg.use_intra_dct_only = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.use_inter_dct_only,
                              argv, err_string)) {
    extra_cfg.use_inter_dct_only = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.use_intra_default_tx_only,
                              argv, err_string)) {
    extra_cfg.use_intra_default_tx_only =
        arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.quant_b_adapt, argv,
                              err_string)) {
    extra_cfg.quant_b_adapt = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.vbr_corpus_complexity_lap,
                              argv, err_string)) {
    extra_cfg.vbr_corpus_complexity_lap =
        arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.set_tier_mask, argv,
                              err_string)) {
    extra_cfg.tier_mask = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.set_min_cr, argv,
                              err_string)) {
    extra_cfg.min_cr = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.coeff_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.coeff_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.mode_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.mode_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.mv_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.mv_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.dv_cost_upd_freq,
                              argv, err_string)) {
    extra_cfg.dv_cost_upd_freq = arg_parse_uint_helper(&arg, err_string);
  }
#if CONFIG_DENOISE
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.denoise_noise_level,
                            argv, err_string)) {
    extra_cfg.noise_level =
        (float)arg_parse_int_helper(&arg, err_string) / 10.0f;
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.denoise_block_size,
                              argv, err_string)) {
    extra_cfg.noise_block_size = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.enable_dnl_denoising,
                              argv, err_string)) {
    extra_cfg.enable_dnl_denoising = arg_parse_uint_helper(&arg, err_string);
  }
#endif
  else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.target_seq_level_idx,
                            argv, err_string)) {
    const int val = arg_parse_int_helper(&arg, err_string);
    const int level = val % 100;
    const int operating_point_idx = val / 100;
    if (operating_point_idx < 0 ||
        operating_point_idx >= MAX_NUM_OPERATING_POINTS) {
      snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
               "Invalid operating point index: %d", operating_point_idx);
      err = AOM_CODEC_INVALID_PARAM;
    } else {
      extra_cfg.target_seq_level_idx[operating_point_idx] = (AV1_LEVEL)level;
    }
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.input_chroma_subsampling_x,
                              argv, err_string)) {
    extra_cfg.chroma_subsampling_x = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.input_chroma_subsampling_y,
                              argv, err_string)) {
    extra_cfg.chroma_subsampling_y = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.passes, argv,
                              err_string)) {
    extra_cfg.passes = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.fwd_kf_dist, argv,
                              err_string)) {
    extra_cfg.fwd_kf_dist = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.two_pass_output, argv,
                              err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.two_pass_output,
                                  &extra_cfg.two_pass_output, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.second_pass_log, argv,
                              err_string)) {
    err = allocate_and_set_string(value, default_extra_cfg.second_pass_log,
                                  &extra_cfg.second_pass_log, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.loopfilter_control,
                              argv, err_string)) {
    extra_cfg.loopfilter_control = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.auto_intra_tools_off,
                              argv, err_string)) {
    extra_cfg.auto_intra_tools_off = arg_parse_uint_helper(&arg, err_string);
  } else if (arg_match_helper(&arg,
                              &g_av1_codec_arg_defs.strict_level_conformance,
                              argv, err_string)) {
    extra_cfg.strict_level_conformance = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.sb_qp_sweep, argv,
                              err_string)) {
    extra_cfg.sb_qp_sweep = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.kf_max_pyr_height,
                              argv, err_string)) {
    extra_cfg.kf_max_pyr_height = arg_parse_int_helper(&arg, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_width, argv,
                              err_string)) {
    ctx->cfg.tile_width_count = arg_parse_list_helper(
        &arg, ctx->cfg.tile_widths, MAX_TILE_WIDTHS, err_string);
  } else if (arg_match_helper(&arg, &g_av1_codec_arg_defs.tile_height, argv,
                              err_string)) {
    ctx->cfg.tile_height_count = arg_parse_list_helper(
        &arg, ctx->cfg.tile_heights, MAX_TILE_HEIGHTS, err_string);
  } else {
    match = 0;
    snprintf(err_string, ARG_ERR_MSG_MAX_LEN, "Cannot find aom option %s",
             name);
  }
  aom_free(argv[0]);

  if (err != AOM_CODEC_OK) {
    ctx->base.err_detail = err_string;
    return err;
  }

  if (strlen(err_string) != 0) {
    ctx->base.err_detail = err_string;
    return AOM_CODEC_INVALID_PARAM;
  }

  ctx->base.err_detail = NULL;

  if (!match) {
    return AOM_CODEC_INVALID_PARAM;
  }
  return update_extra_cfg(ctx, &extra_cfg);
}